

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O2

ssize_t __thiscall Vault::Sys::UI::read(UI *this,int __fd,void *__buf,size_t __nbytes)

{
  Client *client;
  undefined4 in_register_00000034;
  Url UStack_38;
  
  client = *(Client **)CONCAT44(in_register_00000034,__fd);
  getUrl(&UStack_38,(UI *)CONCAT44(in_register_00000034,__fd),(Path *)__buf);
  HttpConsumer::get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)this,client,&UStack_38);
  std::__cxx11::string::~string((string *)&UStack_38);
  return (ssize_t)this;
}

Assistant:

std::optional<std::string> Vault::Sys::UI::read(const Path &path) {
  return HttpConsumer::get(client_, getUrl(path));
}